

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O0

void anurbs::RTree<3L>::register_python(module *m)

{
  char *name_00;
  class_<anurbs::RTree<3l>> *pcVar1;
  arg aVar2;
  undefined1 local_430;
  arg local_428;
  none local_418;
  arg_v local_410;
  arg local_3d0;
  arg local_3c0;
  arg local_3b0;
  arg local_3a0;
  code *local_390;
  undefined8 local_388;
  arg local_380;
  arg local_370;
  none local_360;
  arg_v local_358;
  arg local_318;
  arg local_308;
  arg local_2f8;
  arg local_2e8;
  code *local_2d8;
  undefined8 local_2d0;
  arg local_2c8;
  arg local_2b8;
  none local_2a8;
  arg_v local_2a0;
  arg local_260;
  arg local_250;
  arg local_240;
  arg local_230;
  code *local_220;
  undefined8 local_218;
  arg local_210;
  arg local_200;
  bool local_1e9;
  arg_v local_1e8;
  code *local_1a8;
  undefined8 local_1a0;
  arg local_198;
  arg local_188;
  arg local_178;
  arg local_168;
  code *local_158;
  undefined8 local_150;
  code *local_148;
  undefined8 local_140;
  code *local_138;
  undefined8 local_130;
  code *local_128;
  undefined8 local_120;
  code *local_118;
  undefined8 local_110;
  code *local_108;
  undefined8 local_100;
  code *local_f8;
  undefined8 local_f0;
  code *local_e8;
  undefined8 local_e0;
  arg local_d8;
  arg local_c8;
  int local_b4;
  arg_v local_b0;
  arg local_70;
  arg local_60;
  constructor<long,_long> local_4d [13];
  handle local_40;
  class_<anurbs::RTree<3L>_> local_38;
  string local_30 [8];
  string name;
  module *m_local;
  
  name.field_2._8_8_ = m;
  RTree<3l>::python_name_abi_cxx11_();
  local_40.m_ptr = *(PyObject **)name.field_2._8_8_;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::class_<anurbs::RTree<3L>_>::class_<>(&local_38,local_40,name_00);
  pybind11::init<long,long>();
  local_70 = pybind11::literals::operator____a("nb_items",8);
  local_60.name = local_70.name;
  local_60._8_1_ = local_70._8_1_;
  local_b4 = 0x10;
  local_d8 = pybind11::literals::operator____a("node_size",9);
  local_c8.name = local_d8.name;
  local_c8._8_1_ = local_d8._8_1_;
  pybind11::arg::operator=(&local_b0,&local_c8,&local_b4);
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::def<long,long,pybind11::arg,pybind11::arg_v>
                     ((class_<anurbs::RTree<3l>> *)&local_38,local_4d,&local_60,&local_b0);
  local_e8 = boxes_min;
  local_e0 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>const&(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"_boxes_min",(offset_in_Model_to_subr *)&local_e8);
  local_f8 = boxes_max;
  local_f0 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>const&(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"_boxes_max",(offset_in_Model_to_subr *)&local_f8);
  local_108 = indices;
  local_100 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<std::vector<long,std::allocator<long>>const&(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"indices",(offset_in_Model_to_subr *)&local_108);
  local_118 = min;
  local_110 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<Eigen::Matrix<double,1,3,1,1,3>(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"min",(offset_in_Model_to_subr *)&local_118);
  local_128 = min;
  local_120 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<Eigen::Matrix<double,1,3,1,1,3>(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"max",(offset_in_Model_to_subr *)&local_128);
  local_138 = nb_items;
  local_130 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<long(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"nb_items",(offset_in_Model_to_subr *)&local_138);
  local_148 = node_size;
  local_140 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<long(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"node_size",(offset_in_Model_to_subr *)&local_148);
  local_158 = add;
  local_150 = 0;
  local_178 = pybind11::literals::operator____a("box_a",5);
  local_168.name = local_178.name;
  local_168._8_1_ = local_178._8_1_;
  local_198 = pybind11::literals::operator____a("box_b",5);
  local_188.name = local_198.name;
  local_188._8_1_ = local_198._8_1_;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def<void(anurbs::RTree<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>),pybind11::arg,pybind11::arg>
                     (pcVar1,"add",(offset_in_Model_to_subr *)&local_158,&local_168,&local_188);
  local_1a8 = finish;
  local_1a0 = 0;
  local_1e9 = true;
  local_210 = pybind11::literals::operator____a("hilbert_sort",0xc);
  local_200.name = local_210.name;
  local_200._8_1_ = local_210._8_1_;
  pybind11::arg::operator=(&local_1e8,&local_200,&local_1e9);
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def<void(anurbs::RTree<3l>::*)(bool),pybind11::arg_v>
                     (pcVar1,"finish",(offset_in_Model_to_subr *)&local_1a8,&local_1e8);
  local_220 = by_point;
  local_218 = 0;
  local_240 = pybind11::literals::operator____a("location",8);
  local_230.name = local_240.name;
  local_230._8_1_ = local_240._8_1_;
  local_260 = pybind11::literals::operator____a("tolerance",9);
  local_250.name = local_260.name;
  local_250._8_1_ = local_260._8_1_;
  pybind11::none::none(&local_2a8);
  local_2c8 = pybind11::literals::operator____a("callback",8);
  local_2b8.name = local_2c8.name;
  local_2b8._8_1_ = local_2c8._8_1_;
  pybind11::arg::operator=(&local_2a0,&local_2b8,&local_2a8);
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def<std::vector<long,std::allocator<long>>(anurbs::RTree<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,double,std::function<bool(long)>),pybind11::arg,pybind11::arg,pybind11::arg_v>
                     (pcVar1,"by_point",(offset_in_Model_to_subr *)&local_220,&local_230,&local_250,
                      &local_2a0);
  local_2d8 = by_box;
  local_2d0 = 0;
  local_2f8 = pybind11::literals::operator____a("box_a",5);
  local_2e8.name = local_2f8.name;
  local_2e8._8_1_ = local_2f8._8_1_;
  local_318 = pybind11::literals::operator____a("box_b",5);
  local_308.name = local_318.name;
  local_308._8_1_ = local_318._8_1_;
  pybind11::none::none(&local_360);
  local_380 = pybind11::literals::operator____a("callback",8);
  local_370.name = local_380.name;
  local_370._8_1_ = local_380._8_1_;
  pybind11::arg::operator=(&local_358,&local_370,&local_360);
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def<std::vector<long,std::allocator<long>>(anurbs::RTree<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,std::function<bool(long)>),pybind11::arg,pybind11::arg,pybind11::arg_v>
                     (pcVar1,"by_box",(offset_in_Model_to_subr *)&local_2d8,&local_2e8,&local_308,
                      &local_358);
  local_390 = by_ray;
  local_388 = 0;
  local_3b0 = pybind11::literals::operator____a("origin",6);
  local_3a0.name = local_3b0.name;
  local_3a0._8_1_ = local_3b0._8_1_;
  local_3d0 = pybind11::literals::operator____a("direction",9);
  local_3c0.name = local_3d0.name;
  local_3c0._8_1_ = local_3d0._8_1_;
  pybind11::none::none(&local_418);
  aVar2 = pybind11::literals::operator____a("callback",8);
  local_428.name = aVar2.name;
  local_430 = aVar2._8_1_;
  local_428._8_1_ = local_430;
  pybind11::arg::operator=(&local_410,&local_428,&local_418);
  pybind11::class_<anurbs::RTree<3l>>::
  def<std::vector<long,std::allocator<long>>(anurbs::RTree<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,std::function<bool(long)>),pybind11::arg,pybind11::arg,pybind11::arg_v>
            (pcVar1,"by_ray",(offset_in_Model_to_subr *)&local_390,&local_3a0,&local_3c0,&local_410)
  ;
  pybind11::arg_v::~arg_v(&local_410);
  pybind11::none::~none(&local_418);
  pybind11::arg_v::~arg_v(&local_358);
  pybind11::none::~none(&local_360);
  pybind11::arg_v::~arg_v(&local_2a0);
  pybind11::none::~none(&local_2a8);
  pybind11::arg_v::~arg_v(&local_1e8);
  pybind11::arg_v::~arg_v(&local_b0);
  pybind11::class_<anurbs::RTree<3L>_>::~class_(&local_38);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        const std::string name = Type::python_name();

        py::class_<Type>(m, name.c_str())
            // constructors
            .def(py::init<Index, Index>(), "nb_items"_a, "node_size"_a=16)
            // private read-only properties
            .def_property_readonly("_boxes_min", &Type::boxes_min)
            .def_property_readonly("_boxes_max", &Type::boxes_max)
            // read-only properties
            .def_property_readonly("indices", &Type::indices)
            .def_property_readonly("min", &Type::min)
            .def_property_readonly("max", &Type::min)
            .def_property_readonly("nb_items", &Type::nb_items)
            .def_property_readonly("node_size", &Type::node_size)
            // methods
            .def("add", &Type::add, "box_a"_a, "box_b"_a)
            .def("finish", &Type::finish, "hilbert_sort"_a=true)
            .def("by_point", &Type::by_point, "location"_a, "tolerance"_a, "callback"_a=py::none())
            .def("by_box", &Type::by_box, "box_a"_a, "box_b"_a, "callback"_a=py::none())
            .def("by_ray", &Type::by_ray, "origin"_a, "direction"_a, "callback"_a=py::none())
        ;
    }